

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMull<(moira::Instr)156,(moira::Mode)3,4>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  Syntax SVar2;
  int iVar3;
  char cVar4;
  uint uVar5;
  char *pcVar6;
  long lVar7;
  uint uVar8;
  char *pcVar9;
  bool bVar10;
  Ea<(moira::Mode)3,_4> src;
  u32 local_44;
  ushort local_40;
  
  uVar1 = *addr;
  *addr = uVar1 + 2;
  uVar5 = (*this->_vptr_Moira[6])();
  uVar8 = uVar5 & 0xffff;
  local_40 = op & 7;
  local_44 = *addr;
  bVar10 = (str->style->syntax & ~MOIRA_MIT) == GNU;
  pcVar9 = ":";
  if (bVar10) {
    pcVar9 = ",";
  }
  if ((uVar5 & 0x83f8) == 0 || !bVar10) {
    cVar4 = 'm';
    lVar7 = 0;
    if ((uVar8 >> 0xb & 1) == 0) {
      do {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = cVar4;
        cVar4 = "mulu"[lVar7 + 1];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
    else {
      do {
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = cVar4;
        cVar4 = "fdmuls"[lVar7 + 3];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 4);
    }
    pcVar6 = str->ptr;
    SVar2 = str->style->syntax;
    str->ptr = pcVar6 + 1;
    if (2 < SVar2 - MOIRA_MIT) {
      *pcVar6 = '.';
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
    }
    *pcVar6 = 'l';
    if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    else {
      iVar3 = (str->tab).raw;
      pcVar6 = str->ptr;
      do {
        str->ptr = pcVar6 + 1;
        *pcVar6 = ' ';
        pcVar6 = str->ptr;
      } while (pcVar6 < str->base + iVar3);
    }
    StrWriter::operator<<(str,(Ea<(moira::Mode)3,_4> *)&local_44);
    pcVar6 = str->ptr;
    str->ptr = pcVar6 + 1;
    *pcVar6 = ',';
    SVar2 = str->style->syntax;
    if ((SVar2 < (MUSASHI|MOIRA_MIT)) && ((0x13U >> (SVar2 & 0x1f) & 1) != 0)) {
      pcVar6 = str->ptr;
      str->ptr = pcVar6 + 1;
      *pcVar6 = ' ';
    }
    if ((uVar8 >> 10 & 1) != 0) {
      StrWriter::operator<<(str,(Dn)(uVar5 & 7));
      cVar4 = *pcVar9;
      while (cVar4 != '\0') {
        pcVar9 = pcVar9 + 1;
        pcVar6 = str->ptr;
        str->ptr = pcVar6 + 1;
        *pcVar6 = cVar4;
        cVar4 = *pcVar9;
      }
    }
    StrWriter::operator<<(str,(Dn)(uVar8 >> 0xc & 7));
    if ((str->style->syntax & ~MOIRA_MIT) != GNU) {
      cVar4 = ';';
      lVar7 = 1;
      do {
        pcVar9 = str->ptr;
        str->ptr = pcVar9 + 1;
        *pcVar9 = cVar4;
        cVar4 = "trap%-2s  ; (2+)"[lVar7 + 10];
        lVar7 = lVar7 + 1;
      } while (lVar7 != 7);
    }
    return;
  }
  *addr = uVar1;
  dasmIllegal<(moira::Instr)156,(moira::Mode)3,4>(this,str,addr,op);
  return;
}

Assistant:

void
Moira::dasmMull(StrWriter &str, u32 &addr, u16 op) const
{
    auto old = addr;
    auto ext = dasmIncRead <Word> (addr);
    auto src = Op <M,S> ( _____________xxx(op), addr );
    auto dl  = Dn       ( _xxx____________(ext)      );
    auto dh  = Dn       ( _____________xxx(ext)      );

    auto fill = str.style.syntax == Syntax::GNU || str.style.syntax == Syntax::GNU_MIT ? "," : ":";

    switch (str.style.syntax) {

        case Syntax::GNU:
        case Syntax::GNU_MIT:

            // Catch illegal extension words
            if (!isValidExt(I, M, op, ext)) {

                addr = old;
                dasmIllegal<I, M, S>(str, addr, op);
                return;
            }
            [[fallthrough]];

        default:

            (ext & 1 << 11) ? str << Ins<Instr::MULS>{} : str << Ins<Instr::MULU>{};
            str << Sz<S>{} << str.tab << src << Sep{};
            (ext & 1 << 10) ? str << dh << fill << dl : str << dl;
            str << Av<I, M, S>{};
    }
}